

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

color_quad_u8 __thiscall
crnd::dxt1_block::unpack_color(dxt1_block *this,uint16 packed_color,bool scaled,uint32 alpha)

{
  undefined4 local_24;
  undefined4 local_20;
  uint32 r;
  uint32 g;
  uint32 b;
  uint32 alpha_local;
  bool scaled_local;
  uint16 packed_color_local;
  
  r = packed_color & 0x1f;
  local_20 = (int)(uint)packed_color >> 5 & 0x3f;
  local_24 = (int)(uint)packed_color >> 0xb;
  if (scaled) {
    r = r << 3 | r >> 2;
    local_20 = local_20 << 2 | local_20 >> 4;
    local_24 = local_24 << 3 | local_24 >> 2;
  }
  color_quad<unsigned_char,_int>::color_quad
            ((color_quad<unsigned_char,_int> *)this,local_24,local_20,r,alpha);
  return (color_quad_u8)SUB84(this,0);
}

Assistant:

color_quad_u8 dxt1_block::unpack_color(uint16 packed_color, bool scaled, uint32 alpha)
    {
        uint32 b = packed_color & 31U;
        uint32 g = (packed_color >> 5U) & 63U;
        uint32 r = (packed_color >> 11U) & 31U;

        if (scaled)
        {
            b = (b << 3U) | (b >> 2U);
            g = (g << 2U) | (g >> 4U);
            r = (r << 3U) | (r >> 2U);
        }

        return color_quad_u8(r, g, b, alpha);
    }